

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall mkvmuxer::Cluster::~Cluster(Cluster *this)

{
  _Base_ptr p_Var1;
  Frame *this_00;
  
  while ((this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    while( true ) {
      p_Var1 = (this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var1[1]._M_parent == (_Base_ptr)&p_Var1[1]._M_parent) break;
      this_00 = (Frame *)(p_Var1[1]._M_parent)->_M_left;
      if (this_00 != (Frame *)0x0) {
        Frame::~Frame(this_00);
      }
      operator_delete(this_00);
      std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::pop_front
                ((list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_> *)
                 &(this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                  _M_parent);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
    ::erase(&(this->stored_frames_)._M_t,(key_type *)(p_Var1 + 1));
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->last_block_timestamp_)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  ::~_Rb_tree(&(this->stored_frames_)._M_t);
  return;
}

Assistant:

Cluster::~Cluster() {
  // Delete any stored frames that are left behind. This will happen if the
  // Cluster was not Finalized for whatever reason.
  while (!stored_frames_.empty()) {
    while (!stored_frames_.begin()->second.empty()) {
      delete stored_frames_.begin()->second.front();
      stored_frames_.begin()->second.pop_front();
    }
    stored_frames_.erase(stored_frames_.begin()->first);
  }
}